

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::ImageBlitToImage::submit(ImageBlitToImage *this,SubmitContext *context)

{
  DeviceInterface *pDVar1;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined8 local_24;
  undefined4 local_1c;
  
  pDVar1 = context->m_context->m_context->m_vkd;
  local_68 = 1;
  uStack_60 = 0x100000000;
  local_58 = 0;
  local_50 = 0;
  local_4c._0_4_ = this->m_imageWidth;
  local_4c._4_4_ = this->m_imageHeight;
  local_44 = 0x100000001;
  uStack_3c = 0;
  local_34 = 1;
  uStack_2c = 0;
  local_24._0_4_ = this->m_dstImageWidth;
  local_24._4_4_ = this->m_dstImageHeight;
  local_1c = 1;
  (*pDVar1->_vptr_DeviceInterface[0x61])
            (pDVar1,context->m_commandBuffer,
             (context->m_context->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
             m_data.object.m_internal,(ulong)this->m_imageLayout,
             (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,7,1,&local_68,0);
  return;
}

Assistant:

void ImageBlitToImage::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();
	const vk::VkImageBlit		region			=
	{
		// Src
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{
			{ 0, 0, 0 },
			{
				m_imageWidth,
				m_imageHeight,
				1
			},
		},

		// Dst
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{
			{ 0, 0, 0 },
			{
				m_dstImageWidth,
				m_dstImageHeight,
				1u
			}
		}
	};
	vkd.cmdBlitImage(commandBuffer, context.getImage(), m_imageLayout, *m_dstImage, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1, &region, vk::VK_FILTER_NEAREST);
}